

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::create_module_instantiation(Generator *top)

{
  size_t *psVar1;
  undefined1 local_b8 [8];
  ModuleInstantiationVisitor visitor;
  GeneratorStmtCacheVisitor v;
  
  psVar1 = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002acfb8
  ;
  v.super_IRVisitor.visited_._M_h._M_single_bucket._0_1_ = 1;
  v.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root
            ((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket,top);
  IRVisitor::~IRVisitor((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b8 = (undefined1  [8])&PTR_visit_root_002ad118;
  IRVisitor::visit_generator_root((IRVisitor *)local_b8,top);
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002acfb8
  ;
  v.super_IRVisitor.visited_._M_h._M_single_bucket._0_1_ = 0;
  v.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root
            ((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket,top);
  IRVisitor::~IRVisitor((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  IRVisitor::~IRVisitor((IRVisitor *)local_b8);
  return;
}

Assistant:

void create_module_instantiation(Generator* top) {
    {
        GeneratorStmtCacheVisitor v(true);
        v.visit_generator_root(top);
    }
    ModuleInstantiationVisitor visitor;
    visitor.visit_generator_root(top);
    {
        GeneratorStmtCacheVisitor v(false);
        v.visit_generator_root(top);
    }
}